

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O1

FileName * __thiscall
embree::FileName::operator+(FileName *__return_storage_ptr__,FileName *this,FileName *other)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  __string_type __str;
  undefined1 *local_60;
  ulong local_58;
  undefined1 local_50 [16];
  string local_40;
  
  iVar2 = std::__cxx11::string::compare((char *)this);
  if (iVar2 == 0) {
    (__return_storage_ptr__->filename)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->filename).field_2;
    pcVar1 = (other->filename)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (other->filename)._M_string_length);
  }
  else {
    pcVar1 = (this->filename)._M_dataplus._M_p;
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + (this->filename)._M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)&local_60,local_58,0,'\x01');
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_60,(ulong)(other->filename)._M_dataplus._M_p);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_40.field_2._M_allocated_capacity = *psVar4;
      local_40.field_2._8_8_ = plVar3[3];
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    }
    else {
      local_40.field_2._M_allocated_capacity = *psVar4;
      local_40._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_40._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    FileName(__return_storage_ptr__,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FileName FileName::operator +( const FileName& other ) const {
    if (filename == "") return FileName(other);
    else return FileName(filename + path_sep + other.filename);
  }